

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void HU4_C(uint8_t *dst)

{
  byte bVar1;
  uint8_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int L;
  int K;
  int J;
  int I;
  uint8_t *dst_local;
  
  uVar3 = (uint)dst[0x1f];
  uVar4 = (uint)dst[0x3f];
  bVar1 = dst[0x5f];
  uVar5 = (uint)bVar1;
  *dst = (uint8_t)((int)(dst[-1] + uVar3 + 1) >> 1);
  uVar2 = (uint8_t)((int)(uVar3 + uVar4 + 1) >> 1);
  dst[0x20] = uVar2;
  dst[2] = uVar2;
  uVar2 = (uint8_t)((int)(uVar4 + uVar5 + 1) >> 1);
  dst[0x40] = uVar2;
  dst[0x22] = uVar2;
  dst[1] = (uint8_t)((int)((uint)dst[-1] + uVar3 * 2 + uVar4 + 2) >> 2);
  uVar2 = (uint8_t)((int)(uVar3 + uVar4 * 2 + uVar5 + 2) >> 2);
  dst[0x21] = uVar2;
  dst[3] = uVar2;
  uVar2 = (uint8_t)((int)(uVar4 + uVar5 * 2 + uVar5 + 2) >> 2);
  dst[0x41] = uVar2;
  dst[0x23] = uVar2;
  dst[99] = bVar1;
  dst[0x62] = bVar1;
  dst[0x61] = bVar1;
  dst[0x60] = bVar1;
  dst[0x42] = bVar1;
  dst[0x43] = bVar1;
  return;
}

Assistant:

static void HU4_C(uint8_t* dst) {   // Horizontal-Up
  const int I = dst[-1 + 0 * BPS];
  const int J = dst[-1 + 1 * BPS];
  const int K = dst[-1 + 2 * BPS];
  const int L = dst[-1 + 3 * BPS];
  DST(0, 0) =             AVG2(I, J);
  DST(2, 0) = DST(0, 1) = AVG2(J, K);
  DST(2, 1) = DST(0, 2) = AVG2(K, L);
  DST(1, 0) =             AVG3(I, J, K);
  DST(3, 0) = DST(1, 1) = AVG3(J, K, L);
  DST(3, 1) = DST(1, 2) = AVG3(K, L, L);
  DST(3, 2) = DST(2, 2) =
    DST(0, 3) = DST(1, 3) = DST(2, 3) = DST(3, 3) = L;
}